

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Btree_map_int32_Test::TestBody(Btree_map_int32_Test *this)

{
  undefined4 uVar1;
  uint uVar2;
  undefined *puVar3;
  long lVar4;
  Generator<std::pair<const_int,_int>_> GVar5;
  undefined1 auVar6 [8];
  _Base_ptr p_Var7;
  ulong uVar8;
  Generator<std::pair<const_int,_int>_> GVar9;
  pair<const_int,_int> pVar10;
  mapped_type *pmVar11;
  pointer ppVar12;
  Generator<std::pair<const_int,_int>_> GVar13;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *extraout_RDX;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *extraout_RDX_00;
  undefined8 extraout_RDX_01;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar14;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *values;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  n;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_05;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_06;
  size_type n_00;
  int i;
  int iVar15;
  int in_R8D;
  char *pcVar16;
  btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  *__tmp;
  AssertionResult AVar17;
  int64_t original_bytes1_2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> random_values;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> sorted_values;
  unique_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  container;
  int64_t bytes2;
  Generator<std::pair<const_int,_int>_> generator;
  PropagatingCountingAlloc<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
  allocator2;
  PropagatingCountingAlloc<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
  allocator1;
  value_type local_110;
  value_type local_108;
  value_type local_100;
  undefined1 local_f8 [8];
  _Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_false>
  local_f0;
  _Base_ptr p_Stack_e8;
  pair<const_int,_int> local_e0;
  undefined1 local_d8 [8];
  Generator<int> local_d0;
  Generator<int> GStack_cc;
  _Base_ptr local_c8;
  AssertHelper local_c0;
  _Rb_tree_node_base local_b8;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_98;
  _Rb_tree_node_base local_68;
  pointer local_48;
  CountingAllocator<std::pair<const_int,_int>_> local_40;
  CountingAllocator<std::pair<const_int,_int>_> local_38;
  
  (anonymous_namespace)::
  ConstTest<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>>();
  GenerateValuesWithSeed<std::pair<int,int>>
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_f8,
             (priv *)0x2710,40000,testing::FLAGS_gtest_random_seed,in_R8D);
  local_b8._M_right = &local_b8;
  local_b8._0_8_ =
       &btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
        ::EmptyNode()::empty_node;
  local_b8._M_parent =
       (_Base_ptr)
       &btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
        ::EmptyNode()::empty_node;
  local_b8._M_left = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_d8,
             (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_f8);
  auVar6 = local_d8;
  GVar9.ugen.maxval = GStack_cc.maxval;
  GVar9.tgen.maxval = local_d0.maxval;
  pvVar14 = extraout_RDX;
  if ((Generator<std::pair<const_int,_int>_>)local_d8 != GVar9) {
    uVar8 = (long)GVar9 - (long)local_d8 >> 3;
    lVar4 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_d8,GVar9,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (auVar6,GVar9);
    pvVar14 = extraout_RDX_00;
  }
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>,std::pair<int,int>>
            ((char *)&local_b8,
             (unique_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
              *)local_d8,pvVar14);
  GVar5.ugen.maxval = GStack_cc.maxval;
  GVar5.tgen.maxval = local_d0.maxval;
  pvVar14 = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
            CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),
                     (Generator<std::pair<const_int,_int>_>)local_d8 != GVar5);
  GVar13 = (Generator<std::pair<const_int,_int>_>)((long)GVar5 + -8);
  GVar9 = (Generator<std::pair<const_int,_int>_>)local_d8;
  if ((ulong)local_d8 < (ulong)GVar13 && (Generator<std::pair<const_int,_int>_>)local_d8 != GVar5) {
    do {
      uVar1 = *(undefined4 *)GVar9;
      *(undefined4 *)GVar9 = *(undefined4 *)GVar13;
      *(undefined4 *)GVar13 = uVar1;
      uVar2 = *(int *)((long)GVar9 + 4);
      pvVar14 = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)(ulong)uVar2;
      *(int *)((long)GVar9 + 4) = *(int *)((long)GVar13 + 4);
      *(uint *)((long)GVar13 + 4) = uVar2;
      GVar9 = (Generator<std::pair<const_int,_int>_>)((long)GVar9 + 8);
      GVar13 = (Generator<std::pair<const_int,_int>_>)((long)GVar13 + -8);
    } while ((ulong)GVar9 < (ulong)GVar13);
  }
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>,std::pair<int,int>>
            ((char *)&local_b8,
             (unique_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
              *)local_d8,pvVar14);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>,std::pair<int,int>>
            ((char *)&local_b8,
             (unique_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
              *)local_f8,values);
  if ((Generator<std::pair<const_int,_int>_>)local_d8 != (Generator<std::pair<const_int,_int>_>)0x0)
  {
    operator_delete((void *)local_d8,(long)local_c8 - (long)local_d8);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_98);
  btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  ::~btree((btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            *)&local_b8);
  if (local_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f8,(long)p_Stack_e8 - (long)local_f8);
  }
  local_68._0_8_ = 0;
  local_68._M_parent = (_Base_ptr)0x3e8000003e8;
  local_100.first = 0x20;
  local_100.second = 0;
  local_40.bytes_used_ = (int64_t *)&local_68;
  local_38.bytes_used_ = (int64_t *)&local_100;
  local_48 = (pointer)operator_new(0x20);
  local_68._0_8_ = local_68._0_8_ + 0x20;
  local_68._M_right = (_Base_ptr)operator_new(0x20);
  local_b8._0_8_ =
       btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b8._M_left =
       (_Base_ptr)
       btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b8._M_right = (_Base_ptr)0x0;
  local_d8._0_4_ = local_100.first;
  local_d8._4_4_ = local_100.second;
  local_b8._M_parent = (_Base_ptr)&local_100;
  local_108 = Generator<std::pair<const_int,_int>_>::operator()
                        ((Generator<std::pair<const_int,_int>_> *)&local_68._M_parent,0);
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
            *)local_f8,
           (btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
            *)&local_b8,&local_108);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_f8,"bytes1","original_bytes1",(long *)&local_100,(long *)local_d8);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                          bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2be,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if (local_108 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                 bytes_used_);
  }
  if (local_b8._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                      *)&local_b8,(node_type *)local_b8._0_8_);
  }
  local_b8._0_8_ =
       btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b8._M_left =
       (_Base_ptr)
       btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b8._M_right = (_Base_ptr)0x0;
  local_108.first = 0;
  local_108.second = 0;
  local_110 = (value_type)((ulong)(uint)local_110.second << 0x20);
  local_b8._M_parent = &local_68;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_f8,"b1.size()","0",(unsigned_long *)&local_108,&local_110.first);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                          bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c2,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if (local_108 != (value_type)0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                 bytes_used_);
  }
  local_108.first = 0;
  local_108.second = 0;
  local_110 = (value_type)((ulong)local_110 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_f8,"b2.size()","0",(unsigned_long *)&local_108,&local_110.first);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if ((CountingAllocator<std::pair<const_int,_int>_>)
        local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                          bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c3,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if (local_108 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if ((CountingAllocator<std::pair<const_int,_int>_>)
      local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                 bytes_used_);
  }
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_f8,"bytes1","original_bytes1",(long *)&local_100,(long *)local_d8);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                          bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c4,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if (local_108 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                 bytes_used_);
  }
  iVar15 = 1;
  do {
    local_108 = Generator<std::pair<const_int,_int>_>::operator()
                          ((Generator<std::pair<const_int,_int>_> *)&local_68._M_parent,iVar15);
    btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
              *)local_f8,
             (btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
              *)&local_b8,&local_108);
    iVar15 = iVar15 + 1;
  } while (iVar15 != 1000);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_f8,"bytes2","bytes1",(long *)&local_68,(long *)&local_100);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if ((CountingAllocator<std::pair<const_int,_int>_>)
        local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                          bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2cb,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if (local_108 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if ((CountingAllocator<std::pair<const_int,_int>_>)
      local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                 bytes_used_);
  }
  if (local_b8._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                      *)&local_b8,(node_type *)local_b8._0_8_);
  }
  local_b8._0_8_ =
       btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b8._M_left =
       (_Base_ptr)
       btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b8._M_right = (_Base_ptr)0x0;
  local_d8._0_4_ = local_100.first;
  local_d8._4_4_ = local_100.second;
  local_b8._M_parent = (_Base_ptr)&local_100;
  local_108 = Generator<std::pair<const_int,_int>_>::operator()
                        ((Generator<std::pair<const_int,_int>_> *)&local_68._M_parent,0);
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
            *)local_f8,
           (btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
            *)&local_b8,&local_108);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_f8,"bytes1","original_bytes1",(long *)&local_100,(long *)local_d8);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if ((CountingAllocator<std::pair<const_int,_int>_>)
        local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                          bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d5,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if (local_108 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if ((CountingAllocator<std::pair<const_int,_int>_>)
      local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                 bytes_used_);
  }
  if (local_b8._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                      *)&local_b8,(node_type *)local_b8._0_8_);
  }
  local_b8._0_8_ =
       btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b8._M_left =
       (_Base_ptr)
       btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b8._M_right = (_Base_ptr)0x0;
  local_108.first = 0;
  local_108.second = 0;
  local_110 = (value_type)((ulong)local_110 & 0xffffffff00000000);
  local_b8._M_parent = &local_68;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_f8,"b1.size()","0",(unsigned_long *)&local_108,&local_110.first);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if ((CountingAllocator<std::pair<const_int,_int>_>)
        local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                          bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d9,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if (local_108 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if ((CountingAllocator<std::pair<const_int,_int>_>)
      local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                 bytes_used_);
  }
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_f8,"bytes1","original_bytes1",(long *)&local_100,(long *)local_d8);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                          bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2da,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if (local_108 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if (local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                 bytes_used_);
  }
  iVar15 = 1;
  do {
    local_108 = Generator<std::pair<const_int,_int>_>::operator()
                          ((Generator<std::pair<const_int,_int>_> *)&local_68._M_parent,iVar15);
    btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
              *)local_f8,
             (btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
              *)&local_b8,&local_108);
    iVar15 = iVar15 + 1;
  } while (iVar15 != 1000);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_f8,"bytes2","bytes1",(long *)&local_68,(long *)&local_100);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if ((CountingAllocator<std::pair<const_int,_int>_>)
        local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                          bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2e1,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if (local_108 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
  }
  if ((CountingAllocator<std::pair<const_int,_int>_>)
      local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                 bytes_used_);
  }
  if (local_b8._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                      *)&local_b8,(node_type *)local_b8._0_8_);
  }
  local_b8._0_8_ =
       btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b8._M_left =
       (_Base_ptr)
       btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b8._M_right = (_Base_ptr)0x0;
  local_108 = local_100;
  local_b8._M_parent = (_Base_ptr)&local_100;
  local_110 = Generator<std::pair<const_int,_int>_>::operator()
                        ((Generator<std::pair<const_int,_int>_> *)&local_68._M_parent,0);
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
            *)local_d8,
           (btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
            *)&local_b8,&local_110);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_d8,"bytes1","original_bytes1",(long *)&local_100,(long *)&local_108);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)CONCAT44(GStack_cc.maxval,local_d0.maxval) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(GStack_cc.maxval,local_d0.maxval);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2eb,pcVar16);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_110 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(GStack_cc.maxval,local_d0.maxval) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(GStack_cc.maxval,local_d0.maxval));
  }
  p_Var7 = local_b8._M_right;
  local_68._M_left = (_Base_ptr)local_b8._0_8_;
  local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ =
       (PropagatingCountingAlloc<std::pair<const_int,_int>_>)
       (PropagatingCountingAlloc<std::pair<const_int,_int>_>)local_b8._M_parent;
  p_Stack_e8 = local_b8._M_left;
  local_b8._0_8_ =
       btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
       ::EmptyNode()::empty_node;
  local_f8 = (undefined1  [8])local_68._M_left;
  local_b8._M_left =
       (_Base_ptr)
       btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
       ::EmptyNode()::empty_node;
  local_b8._M_right = (_Base_ptr)0x0;
  local_e0 = (pair<const_int,_int>)p_Var7;
  local_110.first = 0;
  local_110.second = 0;
  local_c0.data_._0_4_ = 0;
  local_b8._M_parent = &local_68;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_d8,"b1.size()","0",(unsigned_long *)&local_110,(int *)&local_c0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)CONCAT44(GStack_cc.maxval,local_d0.maxval) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(GStack_cc.maxval,local_d0.maxval);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2ef,pcVar16);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_110 != (value_type)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(GStack_cc.maxval,local_d0.maxval) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(GStack_cc.maxval,local_d0.maxval));
  }
  local_110 = (value_type)p_Var7;
  local_c0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_d8,"b2.size()","1",(unsigned_long *)&local_110,(int *)&local_c0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)CONCAT44(GStack_cc.maxval,local_d0.maxval) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(GStack_cc.maxval,local_d0.maxval);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f0,pcVar16);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_110 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(GStack_cc.maxval,local_d0.maxval) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(GStack_cc.maxval,local_d0.maxval));
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_d8,"bytes1","original_bytes1",(long *)&local_100,(long *)&local_108);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)CONCAT44(GStack_cc.maxval,local_d0.maxval) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(GStack_cc.maxval,local_d0.maxval);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f1,pcVar16);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_110 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(GStack_cc.maxval,local_d0.maxval) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(GStack_cc.maxval,local_d0.maxval));
  }
  iVar15 = 1;
  do {
    local_110 = Generator<std::pair<const_int,_int>_>::operator()
                          ((Generator<std::pair<const_int,_int>_> *)&local_68._M_parent,iVar15);
    btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
              *)local_d8,
             (btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
              *)&local_b8,&local_110);
    iVar15 = iVar15 + 1;
  } while (iVar15 != 1000);
  AVar17 = testing::internal::CmpHelperGT<long,long>
                     ((internal *)local_d8,"bytes2","bytes1",(long *)&local_68,(long *)&local_100);
  n._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar17.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)CONCAT44(GStack_cc.maxval,local_d0.maxval) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(GStack_cc.maxval,local_d0.maxval);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f8,pcVar16);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    n = extraout_RDX_02.
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl;
    if (local_110 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
      n._M_head_impl = extraout_RDX_03;
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(GStack_cc.maxval,local_d0.maxval) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(GStack_cc.maxval,local_d0.maxval));
    n._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_04.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  if ((pair<const_int,_int>)p_Var7 != (pair<const_int,_int>)0x0) {
    btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                      *)local_f8,(node_type *)local_68._M_left);
    n._M_head_impl = extraout_RDX_05;
  }
  if (local_b8._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                      *)&local_b8,(node_type *)local_b8._0_8_);
    n._M_head_impl = extraout_RDX_06._M_head_impl;
  }
  CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
  ::deallocate((CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
                *)&local_38,local_48,(size_type)n._M_head_impl);
  CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
  ::deallocate((CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
                *)&local_40,(pointer)local_68._M_right,n_00);
  local_b8._0_8_ =
       &btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
        ::EmptyNode()::empty_node;
  local_b8._M_parent =
       (_Base_ptr)
       &btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
        ::EmptyNode()::empty_node;
  local_b8._M_left = (_Base_ptr)0x0;
  iVar15 = 0;
  do {
    local_d8._0_4_ = 1000;
    local_d8._4_4_ = 1000;
    pVar10 = Generator<std::pair<const_int,_int>_>::operator()
                       ((Generator<std::pair<const_int,_int>_> *)local_d8,iVar15);
    local_f8 = (undefined1  [8])pVar10;
    pmVar11 = btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
              ::operator[]((btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                            *)&local_b8,(key_type *)local_f8);
    *pmVar11 = pVar10.second;
    iVar15 = iVar15 + 1;
  } while (iVar15 != 1000);
  local_d8 = (undefined1  [8])local_b8._M_left;
  local_100.first = 1000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_f8,"b.size()","1000",(unsigned_long *)local_d8,&local_100.first);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d8);
    if ((CountingAllocator<std::pair<const_int,_int>_>)
        local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ ==
        (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                          bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x30e,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if ((pair<const_int,_int>)local_d8 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_d8 + 8))();
    }
  }
  if ((CountingAllocator<std::pair<const_int,_int>_>)
      local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ !=
      (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                 bytes_used_);
  }
  if ((local_b8._0_8_ & 7) == 0) {
    puVar3 = *(undefined **)local_b8._0_8_;
    if (((ulong)puVar3 & 7) == 0) {
      local_100.first = 1000;
      local_100.second = 1000;
      local_d8 = (undefined1  [8])
                 Generator<std::pair<const_int,_int>_>::operator()
                           ((Generator<std::pair<const_int,_int>_> *)&local_100,0);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_f8,"b.begin()->first","Generator<value_type>(1000)(0).first",
                 (int *)(puVar3 + 0xc),(int *)local_d8);
      if (local_f8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_d8);
        if ((CountingAllocator<std::pair<const_int,_int>_>)
            local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ ==
            (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
          pcVar16 = "";
        }
        else {
          pcVar16 = *(char **)local_f0._M_head_impl.
                              super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_100,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x313,pcVar16);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)local_d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
        if ((pair<const_int,_int>)local_d8 != (pair<const_int,_int>)0x0) {
          (**(code **)(*(long *)local_d8 + 8))();
        }
      }
      if ((CountingAllocator<std::pair<const_int,_int>_>)
          local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ !=
          (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                     bytes_used_);
      }
      if ((local_b8._0_8_ & 7) != 0) goto LAB_001336a8;
      puVar3 = *(undefined **)local_b8._0_8_;
      if (((ulong)puVar3 & 7) == 0) {
        local_100.first = 1000;
        local_100.second = 1000;
        local_d8 = (undefined1  [8])
                   Generator<std::pair<const_int,_int>_>::operator()
                             ((Generator<std::pair<const_int,_int>_> *)&local_100,0);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_f8,"b.begin()->second","Generator<value_type>(1000)(0).second",
                   (int *)(puVar3 + 0x10),(int *)(local_d8 + 4));
        if (local_f8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_d8);
          if ((CountingAllocator<std::pair<const_int,_int>_>)
              local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_
              == (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
            pcVar16 = "";
          }
          else {
            pcVar16 = *(char **)local_f0._M_head_impl.
                                super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_100,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x314,pcVar16);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)local_d8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
          if ((pair<const_int,_int>)local_d8 != (pair<const_int,_int>)0x0) {
            (**(code **)(*(long *)local_d8 + 8))();
          }
        }
        if ((CountingAllocator<std::pair<const_int,_int>_>)
            local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ !=
            (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                       bytes_used_);
        }
        if (((ulong)local_b8._M_parent & 7) == 0) {
          local_d8 = (undefined1  [8])local_b8._M_parent;
          local_d0.maxval = (int)*(byte *)((long)local_b8._M_parent + 10);
          ppVar12 = std::
                    reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>_>
                    ::operator->((reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>_>
                                  *)local_d8);
          local_68._0_8_ = 0x3e8000003e8;
          local_100 = Generator<std::pair<const_int,_int>_>::operator()
                                ((Generator<std::pair<const_int,_int>_> *)&local_68,999);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_f8,"b.rbegin()->first",
                     "Generator<value_type>(1000)(999).first",&ppVar12->first,&local_100.first);
          if (local_f8[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_d8);
            if (local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                bytes_used_ == (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
              pcVar16 = "";
            }
            else {
              pcVar16 = *(char **)local_f0._M_head_impl.
                                  super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_100,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                       ,0x315,pcVar16);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_100,(Message *)local_d8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
            if ((pair<const_int,_int>)local_d8 != (pair<const_int,_int>)0x0) {
              (**(code **)(*(long *)local_d8 + 8))();
            }
          }
          if (local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_
              != (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                         bytes_used_);
          }
          if (((ulong)local_b8._M_parent & 7) == 0) {
            local_d8 = (undefined1  [8])local_b8._M_parent;
            local_d0.maxval = (int)*(byte *)((long)local_b8._M_parent + 10);
            ppVar12 = std::
                      reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>_>
                      ::operator->((reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>_>
                                    *)local_d8);
            local_68._M_color = 1000;
            local_68._4_4_ = 1000;
            local_100 = Generator<std::pair<const_int,_int>_>::operator()
                                  ((Generator<std::pair<const_int,_int>_> *)&local_68,999);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_f8,"b.rbegin()->second",
                       "Generator<value_type>(1000)(999).second",&ppVar12->second,
                       (int *)((long)&local_100 + 4));
            if (local_f8[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_d8);
              if ((CountingAllocator<std::pair<const_int,_int>_>)
                  local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                  bytes_used_ == (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
                pcVar16 = "";
              }
              else {
                pcVar16 = *(char **)local_f0._M_head_impl.
                                    super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_100,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                         ,0x316,pcVar16);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_100,(Message *)local_d8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
              if ((pair<const_int,_int>)local_d8 != (pair<const_int,_int>)0x0) {
                (**(code **)(*(long *)local_d8 + 8))();
              }
            }
            if ((CountingAllocator<std::pair<const_int,_int>_>)
                local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>.
                bytes_used_ != (CountingAllocator<std::pair<const_int,_int>_>)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f0._M_head_impl.super_CountingAllocator<std::pair<const_int,_int>_>
                           .bytes_used_);
            }
            btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            ::~btree((btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      *)&local_b8);
            return;
          }
        }
        pcVar16 = 
        "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
        ;
        goto LAB_001336eb;
      }
    }
    pcVar16 = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
    ;
  }
  else {
LAB_001336a8:
    pcVar16 = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
  }
LAB_001336eb:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,pcVar16);
}

Assistant:

void BtreeTest() {
        ConstTest<T>();

        using V = typename remove_pair_const<typename T::value_type>::type;
        const std::vector<V> random_values = GenerateValuesWithSeed<V>(
            test_values, 4 * test_values,
            GTEST_FLAG_GET(random_seed));

        unique_checker<T, C> container;

        // Test key insertion/deletion in sorted order.
        std::vector<V> sorted_values(random_values);
        std::sort(sorted_values.begin(), sorted_values.end());
        DoTest("sorted:    ", &container, sorted_values);

        // Test key insertion/deletion in reverse sorted order.
        std::reverse(sorted_values.begin(), sorted_values.end());
        DoTest("rsorted:   ", &container, sorted_values);

        // Test key insertion/deletion in random order.
        DoTest("random:    ", &container, random_values);
    }